

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

_array * array_client_getbuf(t_array_client *x,_glist **glist)

{
  int iVar1;
  _glist *p_Var2;
  _glist *local_58;
  _array *owner_array;
  t_symbol *arraytype;
  int type;
  int onset;
  t_word *vec;
  t_gstub *gs;
  t_template *template;
  _garray *y;
  _glist **glist_local;
  t_array_client *x_local;
  
  y = (_garray *)glist;
  glist_local = (_glist **)x;
  if (x->tc_sym == (t_symbol *)0x0) {
    if (x->tc_struct == (t_symbol *)0x0) {
      x_local = (t_array_client *)0x0;
    }
    else {
      gs = (t_gstub *)template_findbyname(x->tc_struct);
      vec = (t_word *)glist_local[9];
      if ((t_template *)gs == (t_template *)0x0) {
        pd_error(glist_local,"array: couldn\'t find struct %s",(glist_local[10]->gl_obj).te_g.g_pd);
        x_local = (t_array_client *)0x0;
      }
      else {
        iVar1 = gpointer_check((t_gpointer *)(glist_local + 7),0);
        if (iVar1 == 0) {
          pd_error(glist_local,"array: stale or empty pointer");
          x_local = (t_array_client *)0x0;
        }
        else {
          if (vec[1].w_index == 2) {
            _type = glist_local[7];
          }
          else {
            _type = (_glist *)&(glist_local[7]->gl_obj).te_outlet;
          }
          iVar1 = template_find_field((t_template *)gs,(t_symbol *)glist_local[0xb],
                                      (int *)((long)&arraytype + 4),(int *)&arraytype,
                                      (t_symbol **)&owner_array);
          if (iVar1 == 0) {
            pd_error(glist_local,"array: no field named %s",(glist_local[0xb]->gl_obj).te_g.g_pd);
            x_local = (t_array_client *)0x0;
          }
          else if ((int)arraytype == 3) {
            if (vec[1].w_index == 1) {
              (y->x_gobj).g_pd = (t_pd)*vec;
            }
            else {
              local_58 = (_glist *)vec->w_array;
              while (((t_gstub *)local_58->gl_list)->gs_which == 2) {
                local_58 = (((t_gstub *)local_58->gl_list)->gs_un).gs_glist;
              }
              (y->x_gobj).g_pd = local_58->gl_list->g_pd;
            }
            x_local = *(t_array_client **)((long)&(_type->gl_obj).te_g.g_pd + (long)arraytype._4_4_)
            ;
          }
          else {
            pd_error(glist_local,"array: field %s not of type array",
                     (glist_local[0xb]->gl_obj).te_g.g_pd);
            x_local = (t_array_client *)0x0;
          }
        }
      }
    }
  }
  else {
    template = (t_template *)pd_findbyclass(x->tc_sym,garray_class);
    if ((_garray *)template == (_garray *)0x0) {
      pd_error(glist_local,"array: couldn\'t find named array \'%s\'",
               (glist_local[6]->gl_obj).te_g.g_pd);
      (y->x_gobj).g_pd = (t_pd)0x0;
      x_local = (t_array_client *)0x0;
    }
    else {
      p_Var2 = garray_getglist((_garray *)template);
      (y->x_gobj).g_pd = (t_pd)p_Var2;
      x_local = (t_array_client *)garray_getarray((_garray *)template);
    }
  }
  return (_array *)x_local;
}

Assistant:

static t_array *array_client_getbuf(t_array_client *x, t_glist **glist)
{
    if (x->tc_sym)       /* named array object */
    {
        t_garray *y = (t_garray *)pd_findbyclass(x->tc_sym, garray_class);
        if (y)
        {
            *glist = garray_getglist(y);
            return (garray_getarray(y));
        }
        else
        {
            pd_error(x, "array: couldn't find named array '%s'",
                x->tc_sym->s_name);
            *glist = 0;
            return (0);
        }
    }
    else if (x->tc_struct)   /* by pointer */
    {
        t_template *template = template_findbyname(x->tc_struct);
        t_gstub *gs = x->tc_gp.gp_stub;
        t_word *vec;
        int onset, type;
        t_symbol *arraytype;
        if (!template)
        {
            pd_error(x, "array: couldn't find struct %s", x->tc_struct->s_name);
            return (0);
        }
        if (!gpointer_check(&x->tc_gp, 0))
        {
            pd_error(x, "array: stale or empty pointer");
            return (0);
        }
        if (gs->gs_which == GP_ARRAY)
            vec = x->tc_gp.gp_un.gp_w;
        else vec = x->tc_gp.gp_un.gp_scalar->sc_vec;

        if (!template_find_field(template,
            x->tc_field, &onset, &type, &arraytype))
        {
            pd_error(x, "array: no field named %s", x->tc_field->s_name);
            return (0);
        }
        if (type != DT_ARRAY)
        {
            pd_error(x, "array: field %s not of type array",
                x->tc_field->s_name);
            return (0);
        }
        if (gs->gs_which == GP_GLIST)
            *glist = gs->gs_un.gs_glist;
        else
        {
            t_array *owner_array = gs->gs_un.gs_array;
            while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
                owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
            *glist = owner_array->a_gp.gp_stub->gs_un.gs_glist;
        }
        return (*(t_array **)(((char *)vec) + onset));
    }
    else return (0);    /* shouldn't happen */
}